

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O0

bool accelerator_start_where_proc(Am_Object *inter,Am_Object *event_window,Am_Input_Char ic)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *value_00;
  Am_Object local_78;
  Am_Input_Char local_6c;
  Am_Value_List local_68;
  Am_Object cmd;
  undefined1 local_40 [8];
  Am_Value value;
  Am_Value_List accel_list;
  Am_Object *event_window_local;
  Am_Object *inter_local;
  Am_Input_Char ic_local;
  
  Am_Value_List::Am_Value_List((Am_Value_List *)&value.value);
  Am_Value::Am_Value((Am_Value *)local_40);
  pAVar2 = Am_Object::Peek(event_window,0x1e3,0);
  Am_Value::operator=((Am_Value *)local_40,pAVar2);
  bVar1 = Am_Value::Valid((Am_Value *)local_40);
  if ((bVar1) && (bVar1 = Am_Value_List::Test((Am_Value *)local_40), bVar1)) {
    Am_Value_List::operator=((Am_Value_List *)&value.value,(Am_Value *)local_40);
    Am_Value_List::Am_Value_List(&local_68,(Am_Value_List *)&value.value);
    local_6c = ic;
    Am_Object::Am_Object(&local_78,event_window);
    accel_match((Am_Value_List *)&stack0xffffffffffffffa8,SUB84(&local_68,0),
                (Am_Object *)(ulong)(uint)local_6c);
    Am_Object::~Am_Object(&local_78);
    Am_Value_List::~Am_Value_List(&local_68);
    bVar1 = Am_Object::Valid((Am_Object *)&stack0xffffffffffffffa8);
    if (bVar1) {
      pAVar2 = Am_Object::Get((Am_Object *)&stack0xffffffffffffffa8,0xcc,0);
      bVar1 = Am_Value::operator_cast_to_bool(pAVar2);
      if (!bVar1) goto LAB_00351094;
      value_00 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&stack0xffffffffffffffa8);
      Am_Object::Set(inter,0x152,value_00,1);
      inter_local._7_1_ = 1;
      bVar1 = true;
    }
    else {
LAB_00351094:
      bVar1 = false;
    }
    Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffffa8);
    if (bVar1) goto LAB_003510ba;
  }
  inter_local._7_1_ = 0;
LAB_003510ba:
  Am_Value::~Am_Value((Am_Value *)local_40);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&value.value);
  return (bool)(inter_local._7_1_ & 1);
}

Assistant:

Am_Define_Method(Am_Event_Method, bool, accelerator_start_where,
                 (Am_Object inter, Am_Object event_window, Am_Input_Char ic))
{
  Am_INTER_TRACE_PRINT(inter, "testing " << ic << " as accelerator for "
                                         << event_window);
  Am_Value_List accel_list;
  Am_Value value;
  value = event_window.Peek(Am_ACCELERATOR_LIST);
  if (value.Valid() && Am_Value_List::Test(value)) {
    accel_list = value;
    Am_Object cmd = accel_match(accel_list, ic, event_window);
    if (cmd.Valid()) {
      Am_INTER_TRACE_PRINT(inter, "Found accelerator " << cmd);
      if ((bool)cmd.Get(Am_ACTIVE)) {
        inter.Set(Am_ACCELERATOR, cmd, Am_OK_IF_NOT_THERE);
        return true;
      } else {
        Am_INTER_TRACE_PRINT(inter, "-> but not active");
      }
    }
  }
  //if get here, then fail
  return false;
}